

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_TELEPORT_TO(effect_handler_context_t_conflict *context)

{
  bool bVar1;
  bool bVar2;
  chunk_conflict *c;
  player *p;
  _Bool _Var3;
  _Bool _Var4;
  wchar_t wVar5;
  monster *pmVar6;
  loc_conflict grid;
  square_conflict *psVar7;
  byte local_81;
  _Bool player_moves;
  _Bool dim_door;
  _Bool friendly;
  monster *t_mon;
  int local_40;
  wchar_t dir;
  wchar_t ctr;
  wchar_t dis;
  loc_conflict land;
  loc_conflict aim;
  loc_conflict start;
  monster *mon;
  effect_handler_context_t_conflict *context_local;
  
  start.x = L'\0';
  start.y = L'\0';
  dir = L'\0';
  local_40 = 0;
  t_mon._4_4_ = 5;
  pmVar6 = monster_target_monster(context);
  bVar1 = false;
  bVar2 = false;
  _Var3 = false;
  context->ident = true;
  if ((player->upkeep->arena_level & 1U) != 0) {
    return true;
  }
  if (((context->origin).what == SRC_MONSTER) &&
     (start = (loc_conflict)cave_monster(cave,(context->origin).which.monster),
     start == (loc_conflict)0x0)) {
    __assert_fail("mon",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/effect-handler-general.c"
                  ,0xb1f,"_Bool effect_handler_TELEPORT_TO(effect_handler_context_t *)");
  }
  if (pmVar6 == (monster *)0x0) {
    if (context->subtype == 0) {
      if ((start != (loc_conflict)0x0) &&
         (_Var3 = monster_is_decoyed((monster *)start), c = cave, _Var3)) {
        grid = (loc_conflict)cave_find_decoy(cave);
        square_destroy_decoy((chunk *)c,grid);
        return true;
      }
      _Var3 = true;
      aim.x = (player->grid).x;
      aim.y = (player->grid).y;
      _Var4 = square_isno_teleport((chunk *)cave,aim);
      if (_Var4) {
        msg("Teleportation forbidden!");
        return true;
      }
      _Var4 = player_of_has(player,L'\x1d');
      if (_Var4) {
        equip_learn_flag(player,L'\x1d');
        msg("Teleportation forbidden!");
        return true;
      }
    }
    else {
      aim = *(loc_conflict *)((long)start + 0x24);
    }
  }
  else {
    aim.x = (pmVar6->grid).x;
    aim.y = (pmVar6->grid).y;
  }
  if ((context->y == 0) || (context->x == 0)) {
    if (start == (loc_conflict)0x0) {
      bVar1 = true;
      do {
        _Var4 = get_aim_dir((int *)((long)&t_mon + 4));
        if (!_Var4) {
          return false;
        }
        target_get((loc *)&land);
        if ((t_mon._4_4_ == 5) && (_Var4 = los(cave,player->grid,(loc)land), !_Var4)) {
          target_set_location(L'\0',L'\0');
          msg("Target grid must be in view!");
        }
        local_81 = 0;
        if (t_mon._4_4_ == 5) {
          _Var4 = target_okay();
          local_81 = _Var4 ^ 0xff;
        }
      } while ((local_81 & 1) != 0);
      if (t_mon._4_4_ == 5) {
        target_get((loc *)&land);
      }
      else {
        land = (loc_conflict)loc_offset((loc)aim,(int)ddx[t_mon._4_4_],(int)ddy[t_mon._4_4_]);
      }
      _Var4 = square_isvault((chunk *)cave,land);
      if (_Var4) {
        dir = L'\n';
      }
      bVar2 = true;
    }
    else if (context->subtype == 0) {
      land = *(loc_conflict *)((long)start + 0x24);
    }
    else {
      land.x = (player->grid).x;
      land.y = (player->grid).y;
      dir = L'\x02';
    }
  }
  else {
    land = (loc_conflict)loc(context->x,context->y);
  }
  while( true ) {
    do {
      _ctr = (loc_conflict)rand_loc((loc)land,dir,dir);
      _Var4 = square_in_bounds_fully((chunk *)cave,_ctr);
    } while (!_Var4);
    _Var4 = has_teleport_destination_prereqs((chunk *)cave,_ctr,_Var3);
    if (_Var4) break;
    local_40 = local_40 + 1;
    if (dir * 4 * dir + dir * 4 + 1 < local_40) {
      local_40 = 0;
      dir = dir + L'\x01';
    }
  }
  if ((bVar1) &&
     (_Var4 = flag_has_dbg((player->state).pflags,10,0x37,"player->state.pflags","(PF_PHASEWALK)"),
     p = player, _Var4)) {
    wVar5 = distance((loc)aim,(loc)_ctr);
    player_add_speed_boost(p,wVar5 + L'\x14');
  }
  sound(10);
  monster_swap(aim,_ctr);
  if (_Var3 != false) {
    player_handle_post_move(player,true,(context->origin).what == SRC_MONSTER);
  }
  if (bVar2) {
    target_set_location(L'\0',L'\0');
  }
  psVar7 = square((chunk *)cave,_ctr);
  flag_off(psVar7->info,3,0x12);
  handle_stuff(player);
  return true;
}

Assistant:

bool effect_handler_TELEPORT_TO(effect_handler_context_t *context)
{
	struct monster *mon = NULL;
	struct loc start, aim, land;
	int dis = 0, ctr = 0, dir = DIR_TARGET;
	struct monster *t_mon = monster_target_monster(context);
	bool friendly = false;
	bool dim_door = false;
	bool player_moves = false;

	context->ident = true;

	/* No teleporting in arena levels */
	if (player->upkeep->arena_level) return true;

	if (context->origin.what == SRC_MONSTER) {
		mon = cave_monster(cave, context->origin.which.monster);
		assert(mon);
	}

	/* Where are we coming from? */
	if (t_mon) {
		/* Monster being teleported */
		start = t_mon->grid;
	} else if (context->subtype) {
		/* Monster teleporting to the player */
		start = mon->grid;
	} else {
		/* Targeted decoys get destroyed */
		if (mon && monster_is_decoyed(mon)) {
			square_destroy_decoy(cave, cave_find_decoy(cave));
			return true;
		}

		/* Player being teleported */
		player_moves = true;
		start = player->grid;

		/* Check for a no teleport grid */
		if (square_isno_teleport(cave, start)) {
			msg("Teleportation forbidden!");
			return true;
		}

		/* Check for a no teleport curse */
		if (player_of_has(player, OF_NO_TELEPORT)) {
			equip_learn_flag(player, OF_NO_TELEPORT);
			msg("Teleportation forbidden!");
			return true;
		}
	}

	/* Where are we going? */
	if (context->y && context->x) {
		/* Effect was given co-ordinates */
		aim = loc(context->x, context->y);
	} else if (mon) {
		/* Spell cast by monster */
		if (context->subtype) {
			/* Monster teleporting to player */
			aim = player->grid;
			dis = 2;
		} else {
			/* Player being teleported to monster */
			aim = mon->grid;
		}
	} else {
		friendly = true;

		/* Player choice */
		do {
			if (!get_aim_dir(&dir)) return false;

			/* Insist on LoS */
			target_get(&aim);
			if (dir == DIR_TARGET && !los(cave, player->grid, aim)) {
				/* Set a silly target */
				target_set_location(0, 0);
				msg("Target grid must be in view!");
			}
		} while (dir == DIR_TARGET && !target_okay());

		if (dir == DIR_TARGET)
			target_get(&aim);
		else
			aim = loc_offset(start, ddx[dir], ddy[dir]);

		/* Randomise the landing a bit if it's a vault */
		if (square_isvault(cave, aim)) dis = 10;
		dim_door = true;
	}

	/* Find a usable location */
	while (1) {
		/* Pick a nearby legal location */
		while (1) {
			land = rand_loc(aim, dis, dis);
			if (square_in_bounds_fully(cave, land)) break;
		}

		if (has_teleport_destination_prereqs(cave, land,
				player_moves)) break;

		/* Occasionally advance the distance */
		if (++ctr > (4 * dis * dis + 4 * dis + 1)) {
			ctr = 0;
			dis++;
		}
	}

	/* Check for specialty speed boost on friendly teleports */
	if (friendly && player_has(player, PF_PHASEWALK)) {
		player_add_speed_boost(player, 20 + distance(start, land));
	}

	/* Sound */
	sound(MSG_TELEPORT);

	/* Move player or monster */
	monster_swap(start, land);
	if (player_moves) {
		player_handle_post_move(player, true,
			context->origin.what == SRC_MONSTER);
	}

	/* Cancel target if necessary */
	if (dim_door) {
		target_set_location(0, 0);
	}

	/* Clear any projection marker to prevent double processing */
	sqinfo_off(square(cave, land)->info, SQUARE_PROJECT);

	/* Lots of updates after monster_swap() */
	handle_stuff(player);

	return true;
}